

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v9::detail::
for_each_codepoint<fmt::v9::detail::compute_width(fmt::v9::basic_string_view<char>)::count_code_points>
          (detail *this,string_view s,count_code_points f)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  detail *__src;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  byte *pbVar11;
  type size;
  detail *pdVar12;
  size_t __n;
  byte *pbVar13;
  string_view sVar14;
  string_view sVar15;
  anon_class_8_1_54a39806 decode;
  char buf [7];
  count_code_points local_48;
  byte local_40 [8];
  char *local_38;
  
  local_48.count = (size_t *)s.size_;
  pcVar7 = s.data_;
  __src = this;
  pcVar8 = pcVar7;
  if (pcVar7 < (char *)0x4) {
LAB_0012aea7:
    __n = (long)(this + (long)pcVar8) - (long)__src;
    if (__n != 0) {
      local_40[4] = 0;
      local_40[5] = 0;
      local_40[6] = 0;
      local_40[0] = 0;
      local_40[1] = 0;
      local_40[2] = 0;
      local_40[3] = 0;
      memcpy(local_40,__src,__n);
      pbVar11 = local_40;
      do {
        uVar6 = (uint)(*pbVar11 >> 3);
        lVar5 = (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[uVar6];
        uVar4 = (ulong)((0x80ff0000U >> uVar6 & 1) != 0);
        uVar6 = (pbVar11[3] & 0x3f |
                (pbVar11[2] & 0x3f) << 6 |
                (pbVar11[1] & 0x3f) << 0xc |
                ((uint)*pbVar11 & *(uint *)(&DAT_00195ab0 + lVar5 * 4)) << 0x12) >>
                ((&DAT_00195af0)[lVar5 * 4] & 0x1f);
        uVar9 = ((pbVar11[1] >> 2 & 0xfffffff0) + (uint)(pbVar11[2] >> 6) * 4 |
                 (uint)(pbVar11[3] >> 6) | (uint)(uVar6 < *(uint *)(&DAT_00195ad0 + lVar5 * 4)) << 6
                 | (uint)(0x10ffff < uVar6) << 8 | (uint)((uVar6 & 0x7ffff800) == 0xd800) << 7) ^
                0x2a;
        bVar1 = (&DAT_00195b10)[lVar5 * 4] & 0x1f;
        if (uVar9 >> bVar1 == 0) {
          sVar3 = uVar4 + lVar5;
        }
        else {
          sVar3 = 1;
        }
        sVar15.size_ = sVar3;
        sVar15.data_ = (char *)__src;
        bVar2 = anon_func::count_code_points::operator()
                          (&local_48,-(uint)(uVar9 >> bVar1 != 0) | uVar6,sVar15);
        if (!bVar2) {
          return;
        }
        if (uVar9 >> bVar1 == 0) {
          pbVar13 = pbVar11 + lVar5 + uVar4;
        }
        else {
          pbVar13 = pbVar11 + 1;
        }
        __src = __src + ((long)pbVar13 - (long)pbVar11);
        pbVar11 = pbVar13;
      } while ((long)pbVar13 - (long)local_40 < (long)__n);
    }
  }
  else {
    local_38 = pcVar7;
    do {
      pcVar8 = local_38;
      if (this + (long)pcVar7 + -3 <= __src) goto LAB_0012aea7;
      uVar6 = (uint)((byte)*__src >> 3);
      lVar5 = (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[uVar6];
      uVar9 = ((byte)__src[3] & 0x3f |
              ((byte)__src[2] & 0x3f) << 6 |
              ((byte)__src[1] & 0x3f) << 0xc |
              ((uint)(byte)*__src & *(uint *)(&DAT_00195ab0 + lVar5 * 4)) << 0x12) >>
              ((&DAT_00195af0)[lVar5 * 4] & 0x1f);
      uVar10 = (((byte)__src[1] >> 2 & 0xfffffff0) + (uint)((byte)__src[2] >> 6) * 4 |
                (uint)((byte)__src[3] >> 6) |
                (uint)(uVar9 < *(uint *)(&DAT_00195ad0 + lVar5 * 4)) << 6 |
                (uint)(0x10ffff < uVar9) << 8 | (uint)((uVar9 & 0x7ffff800) == 0xd800) << 7) ^ 0x2a;
      if (uVar10 >> ((&DAT_00195b10)[lVar5 * 4] & 0x1f) == 0) {
        uVar4 = (ulong)((0x80ff0000U >> uVar6 & 1) != 0);
        pdVar12 = __src + lVar5 + uVar4;
        sVar3 = uVar4 + lVar5;
      }
      else {
        pdVar12 = __src + 1;
        sVar3 = 1;
      }
      sVar14.size_ = sVar3;
      sVar14.data_ = (char *)__src;
      bVar2 = anon_func::count_code_points::operator()
                        (&local_48,
                         -(uint)(uVar10 >> ((&DAT_00195b10)[lVar5 * 4] & 0x1f) != 0) | uVar9,sVar14)
      ;
      __src = pdVar12;
    } while (bVar2);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void for_each_codepoint(string_view s, F f) {
  auto decode = [f](const char* buf_ptr, const char* ptr) {
    auto cp = uint32_t();
    auto error = 0;
    auto end = utf8_decode(buf_ptr, &cp, &error);
    bool result = f(error ? invalid_code_point : cp,
                    string_view(ptr, error ? 1 : to_unsigned(end - buf_ptr)));
    return result ? (error ? buf_ptr + 1 : end) : nullptr;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) {
      p = decode(p, p);
      if (!p) return;
    }
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    copy_str<char>(p, p + num_chars_left, buf);
    const char* buf_ptr = buf;
    do {
      auto end = decode(buf_ptr, p);
      if (!end) return;
      p += end - buf_ptr;
      buf_ptr = end;
    } while (buf_ptr - buf < num_chars_left);
  }
}